

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_snode_common
               (lyout *out,int level,lys_node *node,lys_module *module,int *par_close_flag,int mask)

{
  int iVar1;
  lys_node *plVar2;
  char *local_40;
  char *status;
  int i;
  int mask_local;
  int *par_close_flag_local;
  lys_module *module_local;
  lys_node *node_local;
  int level_local;
  lyout *out_local;
  
  local_40 = (char *)0x0;
  if (((mask & 1U) != 0) && (node->ext_size != '\0')) {
    yin_print_close_parent(out,par_close_flag);
    yin_print_extension_instances
              (out,level,module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size);
  }
  if ((mask & 2U) != 0) {
    for (status._0_4_ = 0; (int)status < (int)(uint)node->iffeature_size;
        status._0_4_ = (int)status + 1) {
      yin_print_close_parent(out,par_close_flag);
      yin_print_iffeature(out,level,module,node->iffeature + (int)status);
    }
  }
  if ((mask & 4U) != 0) {
    iVar1 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_CONFIG);
    plVar2 = lys_parent(node);
    if (plVar2 == (lys_node *)0x0) {
      if ((node->flags & 2) == 0) {
        if (iVar1 != -1) {
          yin_print_close_parent(out,par_close_flag);
          yin_print_substmt(out,level,LYEXT_SUBSTMT_CONFIG,'\0',"true",module,node->ext,
                            (uint)node->ext_size);
        }
      }
      else {
        yin_print_close_parent(out,par_close_flag);
        yin_print_substmt(out,level,LYEXT_SUBSTMT_CONFIG,'\0',"false",module,node->ext,
                          (uint)node->ext_size);
      }
    }
    else if (((node->flags & 4) != 0) || (iVar1 != -1)) {
      if ((node->flags & 1) == 0) {
        if ((node->flags & 2) != 0) {
          yin_print_close_parent(out,par_close_flag);
          yin_print_substmt(out,level,LYEXT_SUBSTMT_CONFIG,'\0',"false",module,node->ext,
                            (uint)node->ext_size);
        }
      }
      else {
        yin_print_close_parent(out,par_close_flag);
        yin_print_substmt(out,level,LYEXT_SUBSTMT_CONFIG,'\0',"true",module,node->ext,
                          (uint)node->ext_size);
      }
    }
  }
  if (((mask & 8U) != 0) && ((node->nodetype & (LYS_ANYDATA|LYS_LEAF|LYS_CHOICE)) != LYS_UNKNOWN)) {
    if ((node->flags & 0x40) == 0) {
      if ((node->flags & 0x80) != 0) {
        yin_print_close_parent(out,par_close_flag);
        yin_print_substmt(out,level,LYEXT_SUBSTMT_MANDATORY,'\0',"false",module,node->ext,
                          (uint)node->ext_size);
      }
    }
    else {
      yin_print_close_parent(out,par_close_flag);
      yin_print_substmt(out,level,LYEXT_SUBSTMT_MANDATORY,'\0',"true",module,node->ext,
                        (uint)node->ext_size);
    }
  }
  if ((mask & 0x10U) != 0) {
    if ((node->flags & 8) == 0) {
      if ((node->flags & 0x10) == 0) {
        if ((node->flags & 0x20) != 0) {
          yin_print_close_parent(out,par_close_flag);
          local_40 = "obsolete";
        }
      }
      else {
        yin_print_close_parent(out,par_close_flag);
        local_40 = "deprecated";
      }
    }
    else {
      yin_print_close_parent(out,par_close_flag);
      local_40 = "current";
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_STATUS,'\0',local_40,module,node->ext,
                      (uint)node->ext_size);
  }
  if (((mask & 0x20U) != 0) && (node->dsc != (char *)0x0)) {
    yin_print_close_parent(out,par_close_flag);
    yin_print_substmt(out,level,LYEXT_SUBSTMT_DESCRIPTION,'\0',node->dsc,module,node->ext,
                      (uint)node->ext_size);
  }
  if (((mask & 0x40U) != 0) && (node->ref != (char *)0x0)) {
    yin_print_close_parent(out,par_close_flag);
    yin_print_substmt(out,level,LYEXT_SUBSTMT_REFERENCE,'\0',node->ref,module,node->ext,
                      (uint)node->ext_size);
  }
  return;
}

Assistant:

static void
yin_print_snode_common(struct lyout *out, int level, const struct lys_node *node, const struct lys_module *module,
                       int *par_close_flag, int mask)
{
    int i;
    const char *status = NULL;

    /* extensions */
    if ((mask & SNODE_COMMON_EXT) && node->ext_size) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, node->ext, node->ext_size);
    }

    /* if-features */
    if (mask & SNODE_COMMON_IFF) {
        for (i = 0; i < node->iffeature_size; ++i) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_iffeature(out, level, module, &node->iffeature[i]);
        }
    }

    /* config */
    if (mask & SNODE_COMMON_CONFIG) {
        /* get info if there is an extension for the config statement */
        i = lys_ext_iter(node->ext, node->ext_size, 0, LYEXT_SUBSTMT_CONFIG);

        if (lys_parent(node)) {
            if ((node->flags & LYS_CONFIG_SET) || i != -1) {
                /* print config when it differs from the parent or if it has an extension instance ... */
                if (node->flags & LYS_CONFIG_W) {
                    yin_print_close_parent(out, par_close_flag);
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true",
                                      module, node->ext, node->ext_size);
                } else if (node->flags & LYS_CONFIG_R) {
                    yin_print_close_parent(out, par_close_flag);
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false",
                                      module, node->ext, node->ext_size);
                }
            }
        } else if (node->flags & LYS_CONFIG_R) {
            /* ... or it's a top-level state node */
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false",
                              module, node->ext, node->ext_size);
        } else if (i != -1) {
            /* the config has an extension, so we have to print it */
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true",
                              module, node->ext, node->ext_size);
        }
    }

    /* mandatory */
    if ((mask & SNODE_COMMON_MAND) && (node->nodetype & (LYS_LEAF | LYS_CHOICE | LYS_ANYDATA))) {
        if (node->flags & LYS_MAND_TRUE) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "true",
                              module, node->ext, node->ext_size);
        } else if (node->flags & LYS_MAND_FALSE) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "false",
                              module, node->ext, node->ext_size);
        }
    }

    /* status */
    if (mask & SNODE_COMMON_STATUS) {
        if (node->flags & LYS_STATUS_CURR) {
            yin_print_close_parent(out, par_close_flag);
            status = "current";
        } else if (node->flags & LYS_STATUS_DEPRC) {
            yin_print_close_parent(out, par_close_flag);
            status = "deprecated";
        } else if (node->flags & LYS_STATUS_OBSLT) {
            yin_print_close_parent(out, par_close_flag);
            status = "obsolete";
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_STATUS, 0, status, module, node->ext, node->ext_size);
    }

    /* description */
    if ((mask & SNODE_COMMON_DSC) && node->dsc) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, node->dsc,
                           module, node->ext, node->ext_size);
    }

    /* reference */
    if ((mask & SNODE_COMMON_REF) && node->ref) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, node->ref,
                          module, node->ext, node->ext_size);
    }
}